

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall r_comp::Decompiler::~Decompiler(Decompiler *this)

{
  OutStream *this_00;
  Decompiler *this_local;
  
  if ((this->out_stream != (OutStream *)0x0) &&
     (this_00 = this->out_stream, this_00 != (OutStream *)0x0)) {
    OutStream::~OutStream(this_00);
    operator_delete(this_00);
  }
  std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>::~vector
            (&this->imported_objects);
  std::
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~unordered_set(&this->named_objects);
  r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::~vector(&this->renderers);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::~unordered_map(&this->object_indices);
  std::
  unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map(&this->object_names);
  std::
  unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map(&this->variable_names);
  return;
}

Assistant:

Decompiler::~Decompiler()
{
    if (out_stream) {
        delete out_stream;
    }
}